

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise1D::forward
          (DeconvolutionDepthWise1D *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint kernel_w;
  int iVar1;
  int iVar2;
  pointer pMVar3;
  int *piVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  Allocator **ppAVar11;
  int iVar12;
  void *pvVar13;
  int _h;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  void *pvVar17;
  ulong uVar18;
  ulong uVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 in_stack_fffffffffffffe38;
  Mat local_198;
  pointer local_148;
  pointer local_140;
  Mat local_138;
  Mat local_e8;
  Mat local_98;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_50;
  void *local_48;
  void *local_40;
  long local_38;
  
  local_140 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar12 = local_140->h;
  _h = this->group * local_140[1].h;
  kernel_w = local_140[1].w;
  uVar21 = (ulong)kernel_w;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8._20_8_ = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  local_50 = bottom_blobs;
  flatten(local_140 + 1,&local_e8,opt);
  iVar10 = -100;
  if ((local_e8.data == (void *)0x0) || ((long)local_e8.c * local_e8.cstep == 0)) goto LAB_005a3f56;
  local_138.cstep = 0;
  local_138.data = (void *)0x0;
  local_138.refcount._0_4_ = 0;
  local_138.refcount._4_4_ = 0;
  local_138.elemsize._0_4_ = 0;
  local_138._20_8_ = 0;
  local_138.allocator = (Allocator *)0x0;
  local_138.dims = 0;
  local_138.w = 0;
  local_138.h = 0;
  local_138.d = 0;
  local_138.c = 0;
  Mat::create(&local_138,(int)(kernel_w * iVar12 * _h) / this->group,4,opt->workspace_allocator);
  iVar10 = -100;
  local_40 = local_138.data;
  if ((local_138.data != (void *)0x0) && ((long)local_138.c * local_138.cstep != 0)) {
    iVar10 = this->group;
    local_38 = (long)iVar10;
    uVar9 = _h / iVar10;
    uVar18 = (long)iVar12 / (long)iVar10;
    if (0 < local_38) {
      local_48 = local_e8.data;
      iVar10 = (int)uVar18;
      uVar18 = uVar18 & 0xffffffff;
      iVar12 = 0;
      lVar15 = 0;
      do {
        if (0 < (int)uVar9) {
          pvVar17 = (void *)((long)local_138.data + (long)iVar12 * 4);
          pvVar13 = (void *)((long)local_e8.data + (long)iVar12 * 4);
          uVar16 = 0;
          do {
            if (0 < iVar10) {
              uVar19 = 0;
              pvVar14 = pvVar13;
              pvVar20 = pvVar17;
              do {
                if (0 < (int)kernel_w) {
                  uVar22 = 0;
                  do {
                    *(undefined4 *)((long)pvVar20 + uVar22 * 4) =
                         *(undefined4 *)((long)pvVar14 + uVar22 * 4);
                    uVar22 = uVar22 + 1;
                  } while (uVar21 != uVar22);
                }
                uVar19 = uVar19 + 1;
                pvVar20 = (void *)((long)pvVar20 + uVar21 * 4);
                pvVar14 = (void *)((long)pvVar14 + uVar21 * uVar9 * 4);
              } while (uVar19 != uVar18);
            }
            uVar16 = uVar16 + 1;
            pvVar17 = (void *)((long)pvVar17 + uVar21 * uVar18 * 4);
            pvVar13 = (void *)((long)pvVar13 + uVar21 * 4);
          } while (uVar16 != uVar9);
        }
        lVar15 = lVar15 + 1;
        iVar12 = iVar12 + kernel_w * iVar10 * uVar9;
      } while (lVar15 != local_38);
    }
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98._20_8_ = 0;
    local_98.allocator = (Allocator *)0x0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    local_148 = pMVar3;
    if (this->bias_term == 0) {
LAB_005a3c02:
      ppAVar11 = &opt->workspace_allocator;
      iVar12 = local_140->w;
      iVar10 = this->dilation_w;
      iVar1 = this->stride_w;
      iVar2 = this->output_pad_right;
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      if ((this->pad_left < 1) && ((this->pad_right < 1 && (this->output_w < 1)))) {
        if (&local_198 != pMVar3) {
          piVar4 = pMVar3->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          local_198.data = pMVar3->data;
          local_198.refcount._0_4_ = SUB84(pMVar3->refcount,0);
          local_198.refcount._4_4_ = (undefined4)((ulong)pMVar3->refcount >> 0x20);
          local_198.elemsize._0_4_ = (undefined4)pMVar3->elemsize;
          local_198.elemsize._4_4_ = (undefined4)(pMVar3->elemsize >> 0x20);
          local_198.elempack = pMVar3->elempack;
          local_198.allocator = pMVar3->allocator;
          uVar5 = pMVar3->dims;
          uVar6 = pMVar3->w;
          uVar7 = pMVar3->h;
          uVar8 = pMVar3->d;
          local_198.c = pMVar3->c;
          local_198.cstep = pMVar3->cstep;
          local_198.dims = uVar5;
          local_198.w = uVar6;
          local_198.h = uVar7;
          local_198.d = uVar8;
        }
        ppAVar11 = &opt->blob_allocator;
      }
      Mat::create(&local_198,iVar2 + (kernel_w - 1) * iVar10 + (iVar12 + -1) * iVar1 + 1,_h,4,
                  *ppAVar11);
      iVar10 = -100;
      if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
        deconvolutiondepthwise1d
                  (local_140,&local_198,&local_138,&local_98,kernel_w,this->stride_w,
                   this->dilation_w,this->group,this->activation_type,&this->activation_params,
                   (Option *)CONCAT44(_h,in_stack_fffffffffffffe38));
        pMVar3 = local_148;
        cut_padding(this,&local_198,local_148,opt);
        if ((pMVar3->data != (void *)0x0) && (iVar10 = -100, (long)pMVar3->c * pMVar3->cstep != 0))
        {
          iVar10 = 0;
        }
      }
      piVar4 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
    }
    else {
      flatten((local_50->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,&local_98,opt);
      iVar10 = -100;
      if ((local_98.data != (void *)0x0) && ((long)local_98.c * local_98.cstep != 0))
      goto LAB_005a3c02;
    }
    piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if (local_98.data != (void *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98._20_8_ = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
  }
  piVar4 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_138.allocator == (Allocator *)0x0) {
        if (local_138.data != (void *)0x0) {
          free(local_138.data);
        }
      }
      else {
        (*(local_138.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_138.cstep = 0;
  local_138.data = (void *)0x0;
  local_138.refcount._0_4_ = 0;
  local_138.refcount._4_4_ = 0;
  local_138.elemsize._0_4_ = 0;
  local_138._20_8_ = 0;
  local_138.dims = 0;
  local_138.w = 0;
  local_138.h = 0;
  local_138.d = 0;
  local_138.c = 0;
LAB_005a3f56:
  piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int DeconvolutionDepthWise1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.h;
    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.h * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kw to group-outch/group-inch/group-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise1d(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}